

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void pbrt::RealisticCamera::ComputeCardinalPoints(Ray *rIn,Ray *rOut,Float *pz,Float *fz)

{
  Ray *this;
  float *in_RCX;
  float *in_RDX;
  undefined1 auVar3 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  Point3f PVar4;
  Float tp;
  Float tf;
  Float in_stack_ffffffffffffffcc;
  Ray *in_stack_ffffffffffffffd0;
  
  auVar3 = (undefined1  [56])0x0;
  PVar4 = Ray::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  auVar1._0_8_ = PVar4.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar3;
  this = (Ray *)vmovlpd_avx(auVar1._0_16_);
  *in_RCX = -PVar4.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3 = (undefined1  [56])0x0;
  PVar4 = Ray::operator()(this,in_stack_ffffffffffffffcc);
  auVar2._0_8_ = PVar4.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar3;
  vmovlpd_avx(auVar2._0_16_);
  *in_RDX = -PVar4.super_Tuple3<pbrt::Point3,_float>.z;
  return;
}

Assistant:

void RealisticCamera::ComputeCardinalPoints(const Ray &rIn, const Ray &rOut, Float *pz,
                                            Float *fz) {
    Float tf = -rOut.o.x / rOut.d.x;
    *fz = -rOut(tf).z;
    Float tp = (rIn.o.x - rOut.o.x) / rOut.d.x;
    *pz = -rOut(tp).z;
}